

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::tx_valid::test_method(tx_valid *this)

{
  long lVar1;
  string strFlags;
  bool bVar2;
  readonly_property<bool> rVar3;
  _Rb_tree_color flags_00;
  UniValue *pUVar4;
  UniValue *pUVar5;
  UniValue *pUVar6;
  string *psVar7;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  long lVar8;
  mapped_type *pmVar9;
  string *psVar10;
  uint64_t uVar11;
  _Base_ptr p_Var12;
  uint uVar13;
  iterator in_R8;
  PrecomputedTransactionData *pPVar14;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  uint uVar17;
  uint flags_01;
  long in_FS_OFFSET;
  const_string file;
  string_view jsondata;
  string_view hex;
  const_string file_00;
  const_string file_01;
  string_view hex_str;
  Span<const_std::byte> sp;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  undefined4 uVar18;
  undefined4 uVar19;
  check_type cVar20;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_01;
  RandomMixin<FastRandomContext> *this_02;
  char *local_668;
  char *local_660;
  undefined1 *local_658;
  undefined1 *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  assertion_result local_628;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  assertion_result local_5e0;
  char *local_5c8;
  assertion_result local_5c0;
  _Base_ptr local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  uint flags;
  char *local_578;
  char *local_570;
  undefined1 *local_568;
  undefined1 *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  undefined1 local_538 [16];
  undefined ***local_528;
  string *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  DataStream stream;
  char *local_478;
  char *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 local_3e8 [8];
  element_type *local_3e0;
  shared_count sStack_3d8;
  _Base_ptr local_3d0;
  _Rb_tree_node_base local_3b8;
  string local_398 [32];
  PrecomputedTransactionData txdata;
  TxValidationState state;
  CTransaction tx;
  string transaction;
  UniValue inputs;
  map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
  mapprevOutValues;
  map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
  mapprevOutScriptPubKeys;
  string strTest;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xc4;
  file.m_begin = (iterator)&local_3f8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_408,msg);
  bVar2 = CheckMapFlagNames();
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                           super__Vector_impl_data._M_start._1_7_,bVar2);
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
       0xffffffffffffff00;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       &PTR__lazy_ostream_01148fd0;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       boost::unit_test::lazy_ostream::inst;
  txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       anon_var_dwarf_1182367;
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_410 = "";
  pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
  psVar10 = (string *)&DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&tx,(lazy_ostream *)&txdata,1,1,WARN,_cVar20,(size_t)&local_418,
             0xc4);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  jsondata._M_str =
       "[\n[\"The following are deserialized transactions which are valid.\"],\n[\"They are in the form\"],\n[\"[[[prevout hash, prevout index, prevout scriptPubKey, amount?], [input 2], ...],\"],\n[\"serializedTransaction, excluded verifyFlags]\"],\n[\"Objects that are only a single string (like this one) are ignored\"],\n\n[\"The following is 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is of particular interest because it contains an invalidly-encoded signature which OpenSSL accepts\"],\n[\"See http://r6.ca/blog/20111119T211504Z.html\"],\n[\"It is also the first OP_CHECKMULTISIG transaction in standard form\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e1060bc14e518db2b49aa43ad90ba26000000000490047304402203f16c6f40162ab686621ef3000b04e75418a0c0cb2d8aebeac894ae360ac1e780220ddc15ecdfc3507ac48e1681a33eb60996631bf6bf5bc0a0682c4db743ce7ca2b01ffffffff0140420f00000000001976a914660d4ef3a743e3e696ad990364e555c271ad504b88ac00000000\", \"DERSIG,LOW_S,STRICTENC\"],\n\n[\"The following is a tweaked form of 23b397edccd3740a74adb603c9756370fafcde9bcc4483eb271ecad09a94dd63\"],\n[\"It is an OP_CHECKMULTISIG with an arbitrary extra byte stuffed into the signature at pos length - 2\"],\n[\"The dummy byte is fine however, so the NULLDUMMY flag should be happy\"],\n[[[\"60a20bd93aa49ab4b28d514ec10b06e1829ce6818ec06cd3aabd013ebcdc4bb1\", 0, \"1 0x41 0x04cc71eb30d653c0c3163990c47b976f3fb3f37cccdcbedb169a1dfef58bbfbfaff7d8a473e7e2e6d317b87bafe8bde97e3cf8f065dec022b51d11fcdd0d348ac4 0x41 0x0461cbdcc5409fb4b4d42b51d33381354d80e550078cb532a34bfa2fcfdeb7d76519aecc62770f5b0e4ef8551946d8a540911abe3e7854a26f39f58b25c15342af 2 OP_CHECKMULTISIG\"]],\n\"0100000001b14bdcbc3e01bdaad36cc08e81e69c82e10..." /* TRUNCATED STRING LITERAL */
  ;
  jsondata._M_len = 0x14f90;
  read_json(&tests,jsondata);
  this_02 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.super_RandomMixin<FastRandomContext>;
  this_01 = &txdata.m_spent_outputs;
  uVar13 = 0;
  do {
    if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar13) {
      UniValue::~UniValue(&tests);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
LAB_0052aa08:
      __stack_chk_fail();
    }
    pUVar4 = UniValue::operator[](&tests,(ulong)uVar13);
    UniValue::write_abi_cxx11_((UniValue *)&strTest,(int)pUVar4,(void *)0x0,0);
    pUVar5 = UniValue::operator[](pUVar4,0);
    if (pUVar5->typ == VARR) {
      if ((long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pUVar4->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_start == 0x108) {
        pUVar5 = UniValue::operator[](pUVar4,1);
        if (pUVar5->typ == VSTR) {
          pUVar5 = UniValue::operator[](pUVar4,2);
          if (pUVar5->typ == VSTR) {
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
            ;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 mapprevOutValues._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 mapprevOutScriptPubKeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            pUVar5 = UniValue::operator[](pUVar4,0);
            pUVar5 = UniValue::get_array(pUVar5);
            UniValue::UniValue(&inputs,pUVar5);
            uVar17 = 0;
            while( true ) {
              if ((ulong)(((long)inputs.values.
                                 super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                          (long)inputs.values.
                                super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                super__Vector_impl_data._M_start) / 0x58) <= (ulong)uVar17) break;
              pUVar5 = UniValue::operator[](&inputs,(ulong)uVar17);
              if (pUVar5->typ != VARR) {
LAB_00529a3c:
                local_458 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_450 = "";
                local_468 = &boost::unit_test::basic_cstring<char_const>::null;
                local_460 = &boost::unit_test::basic_cstring<char_const>::null;
                file_01.m_end = (iterator)0xec;
                file_01.m_begin = (iterator)&local_458;
                msg_01.m_end = (iterator)psVar10;
                msg_01.m_begin = (iterator)pPVar14;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                           (size_t)&local_468,msg_01);
                state.super_ValidationState<TxValidationResult>._0_8_ =
                     state.super_ValidationState<TxValidationResult>._0_8_ & 0xffffffffffffff00;
                state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                     (pointer)0x0;
                state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0
                ;
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00
                              );
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01147bd8;
                tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)boost::unit_test::lazy_ostream::inst;
                tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_259747;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                     txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
                     0xffffffffffffff00;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                     &PTR__lazy_ostream_01147c18;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = &tx;
                txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                     &strTest;
                local_478 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_470 = "";
                pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
                psVar10 = (string *)&DAT_00000001;
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&state,(lazy_ostream *)&txdata,1,1,WARN,_cVar20,
                           (size_t)&local_478,0xec);
                boost::detail::shared_count::~shared_count
                          ((shared_count *)
                           &state.super_ValidationState<TxValidationResult>.m_reject_reason.
                            _M_string_length);
                goto LAB_0052a700;
              }
              pUVar5 = UniValue::get_array(pUVar5);
              if (((long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pUVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x58 - 5U < 0xfffffffffffffffe)
              goto LAB_00529a3c;
              pUVar6 = UniValue::operator[](pUVar5,0);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
              hex._M_str = (psVar7->_M_dataplus)._M_p;
              hex._M_len = psVar7->_M_string_length;
              transaction_identifier<false>::FromHex
                        ((optional<transaction_identifier<false>_> *)&tx,hex);
              if ((char)tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                        super__Vector_impl_data._M_finish == '\0') {
                if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
                  std::__throw_bad_optional_access();
                }
                goto LAB_0052aa08;
              }
              pUVar6 = UniValue::operator[](pUVar5,1);
              txdata.m_sequences_single_hash.super_base_blob<256U>.m_data._M_elems._0_4_ =
                   UniValue::getInt<int>(pUVar6);
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                   tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start;
              txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                   tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              pUVar6 = UniValue::operator[](pUVar5,2);
              psVar7 = UniValue::get_str_abi_cxx11_(pUVar6);
              ParseScript((CScript *)&tx,psVar7);
              this_00 = &std::
                         map<COutPoint,_CScript,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
                         ::operator[](&mapprevOutScriptPubKeys,(key_type *)&txdata)->
                         super_CScriptBase;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                        (this_00,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)&tx);
              prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                        ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&tx);
              if (3 < (ulong)(((long)(pUVar5->values).
                                     super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)(pUVar5->values).
                                    super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                    super__Vector_impl_data._M_start) / 0x58)) {
                pUVar5 = UniValue::operator[](pUVar5,3);
                lVar8 = UniValue::getInt<long>(pUVar5);
                pmVar9 = std::
                         map<COutPoint,_long,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
                         ::operator[](&mapprevOutValues,(key_type *)&txdata);
                *pmVar9 = lVar8;
              }
              uVar17 = uVar17 + 1;
            }
            pUVar5 = UniValue::operator[](pUVar4,1);
            psVar7 = UniValue::get_str_abi_cxx11_(pUVar5);
            std::__cxx11::string::string((string *)&transaction,psVar7);
            hex_str._M_str = transaction._M_dataplus._M_p;
            hex_str._M_len = transaction._M_string_length;
            ParseHex<unsigned_char>
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txdata,hex_str);
            sp.m_size = txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ -
                        txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            sp.m_data = (byte *)txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems.
                                _0_8_;
            DataStream::DataStream(&stream,sp);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txdata);
            CTransaction::CTransaction<DataStream>(&tx,&::TX_WITH_WITNESS,&stream);
            state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
            state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
            state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)&state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
            state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
            state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0]
                 = '\0';
            state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
                 (pointer)&state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
            state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
            state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0]
                 = '\0';
            local_4a8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4a0 = "";
            local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_02.m_end = (iterator)0xf5;
            file_02.m_begin = (iterator)&local_4a8;
            msg_02.m_end = (iterator)psVar10;
            msg_02.m_begin = (iterator)pPVar14;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                       (size_t)&local_4b8,msg_02);
            rVar3.super_class_property<bool>.value =
                 (class_property<bool>)CheckTransaction(&tx,&state);
            local_3e0 = (element_type *)0x0;
            sStack_3d8.pi_ = (sp_counted_base *)0x0;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
                 0xffffffffffffff00;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 &PTR__lazy_ostream_01147fb0;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &strTest;
            local_4c8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4c0 = "";
            pvVar15 = &DAT_00000001;
            pvVar16 = &DAT_00000001;
            local_3e8[0] = rVar3.super_class_property<bool>.value;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_3e8,(lazy_ostream *)&txdata,1,1,WARN,_cVar20,
                       (size_t)&local_4c8,0xf5);
            boost::detail::shared_count::~shared_count(&sStack_3d8);
            local_4d8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4d0 = "";
            local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_03.m_end = (iterator)0xf6;
            file_03.m_begin = (iterator)&local_4d8;
            msg_03.m_end = pvVar16;
            msg_03.m_begin = pvVar15;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                       (size_t)&local_4e8,msg_03);
            local_3e8[0] = (class_property<bool>)
                           (class_property<bool>)
                           (state.super_ValidationState<TxValidationResult>.m_mode == M_VALID);
            local_3e0 = (element_type *)0x0;
            sStack_3d8.pi_ = (sp_counted_base *)0x0;
            local_538._0_8_ = "state.IsValid()";
            local_538._8_8_ = "";
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
                 txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
                 0xffffffffffffff00;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 &PTR__lazy_ostream_011481f0;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
                 boost::unit_test::lazy_ostream::inst;
            txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = local_538;
            local_4f8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_4f0 = "";
            uVar18 = 0;
            uVar19 = 0;
            pvVar15 = &DAT_00000001;
            pvVar16 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      ((assertion_result *)local_3e8,(lazy_ostream *)&txdata,1,0,WARN,_cVar20,
                       (size_t)&local_4f8,0xf6);
            boost::detail::shared_count::~shared_count(&sStack_3d8);
            PrecomputedTransactionData::PrecomputedTransactionData<CTransaction>(&txdata,&tx);
            pUVar4 = UniValue::operator[](pUVar4,2);
            psVar10 = UniValue::get_str_abi_cxx11_(pUVar4);
            std::__cxx11::string::string(local_398,psVar10);
            strFlags._M_dataplus._M_p._4_4_ = uVar19;
            strFlags._M_dataplus._M_p._0_4_ = uVar18;
            strFlags._M_string_length = (size_type)_cVar20;
            strFlags.field_2._M_allocated_capacity = (size_type)this_01;
            strFlags.field_2._8_8_ = this_02;
            flags_00 = ParseScriptFlags(strFlags);
            std::__cxx11::string::~string(local_398);
            flags_01 = ~flags_00;
            uVar17 = FillFlags(flags_01);
            if (uVar17 != flags_01) {
              local_508 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_500 = "";
              local_518 = &boost::unit_test::basic_cstring<char_const>::null;
              local_510 = &boost::unit_test::basic_cstring<char_const>::null;
              file_04.m_end = (iterator)0xfd;
              file_04.m_begin = (iterator)&local_508;
              msg_04.m_end = pvVar16;
              msg_04.m_begin = pvVar15;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                         (size_t)&local_518,msg_04);
              local_5c0._0_8_ = local_5c0._0_8_ & 0xffffffffffffff00;
              local_5c0.m_message.px = (element_type *)0x0;
              local_5c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_538._8_8_ = local_538._8_8_ & 0xffffffffffffff00;
              local_538._0_8_ = &PTR__lazy_ostream_0114ce70;
              local_528 = (undefined ***)boost::unit_test::lazy_ostream::inst;
              local_520 = (string *)0xc54088;
              local_3e0 = (element_type *)((ulong)local_3e0 & 0xffffffffffffff00);
              local_3e8 = (undefined1  [8])&PTR__lazy_ostream_0114ceb0;
              sStack_3d8.pi_ = (sp_counted_base *)local_538;
              local_3d0 = (_Base_ptr)&strTest;
              local_548 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
              ;
              local_540 = "";
              pvVar15 = &DAT_00000001;
              pvVar16 = &DAT_00000001;
              boost::test_tools::tt_detail::report_assertion
                        (&local_5c0,(lazy_ostream *)local_3e8,1,1,WARN,_cVar20,(size_t)&local_548,
                         0xfd);
              boost::detail::shared_count::~shared_count(&local_5c0.m_message.pn);
            }
            local_558 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_550 = "";
            local_568 = &boost::unit_test::basic_cstring<char_const>::null;
            local_560 = &boost::unit_test::basic_cstring<char_const>::null;
            file_05.m_end = (iterator)0x101;
            file_05.m_begin = (iterator)&local_558;
            msg_05.m_end = pvVar16;
            msg_05.m_begin = pvVar15;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                       (size_t)&local_568,msg_05);
            bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,flags_01,&txdata,
                                   &strTest,true);
            local_5c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar2;
            local_5c0.m_message.px = (element_type *)0x0;
            local_5c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_538._8_8_ = local_538._8_8_ & 0xffffffffffffff00;
            local_538._0_8_ = &PTR__lazy_ostream_01147cd8;
            local_528 = (undefined ***)boost::unit_test::lazy_ostream::inst;
            local_520 = (string *)0xc54099;
            local_3e0 = (element_type *)((ulong)local_3e0 & 0xffffffffffffff00);
            local_3e8 = (undefined1  [8])&PTR__lazy_ostream_0114cef0;
            sStack_3d8.pi_ = (sp_counted_base *)local_538;
            local_578 = 
            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
            ;
            local_570 = "";
            pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
            psVar10 = (string *)&DAT_00000001;
            local_3d0 = (_Base_ptr)&strTest;
            boost::test_tools::tt_detail::report_assertion
                      (&local_5c0,(lazy_ostream *)local_3e8,1,1,WARN,_cVar20,(size_t)&local_578,
                       0x101);
            boost::detail::shared_count::~shared_count(&local_5c0.m_message.pn);
            for (p_Var12 = mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_left;
                (_Rb_tree_header *)p_Var12 !=
                &mapFlagNames_abi_cxx11_._M_t._M_impl.super__Rb_tree_header;
                p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12)) {
              flags = TrimFlags(~(p_Var12[2]._M_color | flags_00));
              psVar10 = &strTest;
              pPVar14 = &txdata;
              bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,flags,&txdata,
                                     psVar10,true);
              if (!bVar2) {
                local_590 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_588 = "";
                local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_598 = &boost::unit_test::basic_cstring<char_const>::null;
                file_06.m_end = (iterator)0x108;
                file_06.m_begin = (iterator)&local_590;
                msg_06.m_end = (iterator)psVar10;
                msg_06.m_begin = (iterator)pPVar14;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                           (size_t)&local_5a0,msg_06);
                local_5a8 = p_Var12 + 1;
                local_5c0.m_message.px =
                     (element_type *)((ulong)local_5c0.m_message.px & 0xffffffffffffff00);
                local_5c0._0_8_ = &PTR__lazy_ostream_0114cf30;
                local_5c0.m_message.pn.pi_ = (sp_counted_base *)&local_5e0;
                local_3b8._M_color._0_1_ = _S_red;
                local_3b8._M_parent = (_Base_ptr)0x0;
                local_3b8._M_left = (_Base_ptr)0x0;
                local_5e0.m_message.px =
                     (element_type *)((ulong)local_5e0.m_message.px & 0xffffffffffffff00);
                local_5e0._0_8_ = &PTR__lazy_ostream_0114a848;
                local_5e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5c8 = "Tx unexpectedly failed with flag ";
                local_538._8_8_ = local_538._8_8_ & 0xffffffffffffff00;
                local_538._0_8_ = &PTR__lazy_ostream_0114cf70;
                local_528 = (undefined ***)&local_5c0;
                local_520 = (string *)0xc5410c;
                local_3e0 = (element_type *)((ulong)local_3e0 & 0xffffffffffffff00);
                local_3e8 = (undefined1  [8])&PTR__lazy_ostream_0114cfb0;
                sStack_3d8.pi_ = (sp_counted_base *)local_538;
                local_3d0 = (_Base_ptr)&strTest;
                local_5f0 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_5e8 = "";
                boost::test_tools::tt_detail::report_assertion
                          ((assertion_result *)&local_3b8,(lazy_ostream *)local_3e8,1,1,WARN,_cVar20
                           ,(size_t)&local_5f0,0x108);
                boost::detail::shared_count::~shared_count((shared_count *)&local_3b8._M_left);
              }
              uVar11 = RandomMixin<FastRandomContext>::randbits
                                 (this_02,(int)mapFlagNames_abi_cxx11_._M_t._M_impl.
                                               super__Rb_tree_header._M_node_count);
              flags = TrimFlags(~((_Rb_tree_color)uVar11 | flags_00));
              psVar10 = &strTest;
              pPVar14 = &txdata;
              bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,flags,&txdata,
                                     psVar10,true);
              if (!bVar2) {
                local_600 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_5f8 = "";
                local_610 = &boost::unit_test::basic_cstring<char_const>::null;
                local_608 = &boost::unit_test::basic_cstring<char_const>::null;
                file_07.m_end = (iterator)0x10d;
                file_07.m_begin = (iterator)&local_600;
                msg_07.m_end = (iterator)psVar10;
                msg_07.m_begin = (iterator)pPVar14;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                           (size_t)&local_610,msg_07);
                local_628.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>
                .value = (readonly_property<bool>)(class_property<bool>)0x0;
                local_628.m_message.px = (element_type *)0x0;
                local_628.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_5e0.m_message.px =
                     (element_type *)((ulong)local_5e0.m_message.px & 0xffffffffffffff00);
                local_5e0._0_8_ = &PTR__lazy_ostream_01147a70;
                local_5e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5c8 = "Tx unexpectedly failed with random flags ";
                util::ToString<unsigned_int>((string *)&local_3b8,&flags);
                local_5c0.m_message.px =
                     (element_type *)((ulong)local_5c0.m_message.px & 0xffffffffffffff00);
                local_5c0._0_8_ = &PTR__lazy_ostream_0114cff0;
                local_5c0.m_message.pn.pi_ = (sp_counted_base *)&local_5e0;
                local_538._8_8_ = local_538._8_8_ & 0xffffffffffffff00;
                local_538._0_8_ = &PTR__lazy_ostream_0114d030;
                local_528 = (undefined ***)&local_5c0;
                local_520 = (string *)0xb60dce;
                local_3e0 = (element_type *)((ulong)local_3e0 & 0xffffffffffffff00);
                local_3e8 = (undefined1  [8])&PTR__lazy_ostream_0114d070;
                sStack_3d8.pi_ = (sp_counted_base *)local_538;
                local_3d0 = (_Base_ptr)&strTest;
                local_638 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_630 = "";
                pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
                psVar10 = (string *)&DAT_00000001;
                local_5a8 = &local_3b8;
                boost::test_tools::tt_detail::report_assertion
                          (&local_628,(lazy_ostream *)local_3e8,1,1,WARN,_cVar20,(size_t)&local_638,
                           0x10d);
                std::__cxx11::string::~string((string *)&local_3b8);
                boost::detail::shared_count::~shared_count(&local_628.m_message.pn);
              }
            }
            ExcludeIndividualFlags
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       local_3e8,flags_00);
            for (p_Var12 = local_3d0; p_Var12 != (_Base_ptr)&local_3e0;
                p_Var12 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var12)) {
              psVar10 = &strTest;
              pPVar14 = &txdata;
              bVar2 = CheckTxScripts(&tx,&mapprevOutScriptPubKeys,&mapprevOutValues,
                                     ~p_Var12[1]._M_color,&txdata,psVar10,false);
              if (!bVar2) {
                local_648 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_640 = "";
                local_658 = &boost::unit_test::basic_cstring<char_const>::null;
                local_650 = &boost::unit_test::basic_cstring<char_const>::null;
                file_08.m_end = (iterator)0x114;
                file_08.m_begin = (iterator)&local_648;
                msg_08.m_end = (iterator)psVar10;
                msg_08.m_begin = (iterator)pPVar14;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                           (size_t)&local_658,msg_08);
                local_5e0._0_8_ = local_5e0._0_8_ & 0xffffffffffffff00;
                local_5e0.m_message.px = (element_type *)0x0;
                local_5e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
                local_5c0.m_message.px =
                     (element_type *)((ulong)local_5c0.m_message.px & 0xffffffffffffff00);
                local_5c0._0_8_ = &PTR__lazy_ostream_0114a2a8;
                local_5c0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst
                ;
                local_5a8 = (_Base_ptr)0xc540fe;
                local_538._8_8_ = local_538._8_8_ & 0xffffffffffffff00;
                local_538._0_8_ = &PTR__lazy_ostream_0114a268;
                local_528 = (undefined ***)&local_5c0;
                local_520 = &strTest;
                local_668 = 
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
                ;
                local_660 = "";
                pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
                psVar10 = (string *)&DAT_00000001;
                boost::test_tools::tt_detail::report_assertion
                          (&local_5e0,(lazy_ostream *)local_538,1,1,WARN,_cVar20,(size_t)&local_668,
                           0x114);
                boost::detail::shared_count::~shared_count(&local_5e0.m_message.pn);
              }
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_3e8);
            std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_01);
            ValidationState<TxValidationResult>::~ValidationState
                      (&state.super_ValidationState<TxValidationResult>);
            CTransaction::~CTransaction(&tx);
            std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                      ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&stream);
            std::__cxx11::string::~string((string *)&transaction);
LAB_0052a700:
            UniValue::~UniValue(&inputs);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_long>,_std::_Select1st<std::pair<const_COutPoint,_long>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_long>_>_>
            ::~_Rb_tree(&mapprevOutValues._M_t);
            std::
            _Rb_tree<COutPoint,_std::pair<const_COutPoint,_CScript>,_std::_Select1st<std::pair<const_COutPoint,_CScript>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_CScript>_>_>
            ::~_Rb_tree(&mapprevOutScriptPubKeys._M_t);
            goto LAB_00529a28;
          }
        }
      }
      local_428 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_420 = "";
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      local_430 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xcf;
      file_00.m_begin = (iterator)&local_428;
      msg_00.m_end = (iterator)psVar10;
      msg_00.m_begin = (iterator)pPVar14;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_438,
                 msg_00);
      inputs.typ._0_1_ = VNULL;
      inputs.val._M_dataplus._M_p = (pointer)0x0;
      inputs.val._M_string_length = 0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_01147bd8;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)anon_var_dwarf_259747;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
           txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._8_8_ &
           0xffffffffffffff00;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
           &PTR__lazy_ostream_01147c18;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = &tx;
      txdata.m_prevouts_single_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = &strTest;
      local_448 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
      ;
      local_440 = "";
      pPVar14 = (PrecomputedTransactionData *)&DAT_00000001;
      psVar10 = (string *)&DAT_00000001;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&inputs,(lazy_ostream *)&txdata,1,1,WARN,_cVar20,
                 (size_t)&local_448,0xcf);
      boost::detail::shared_count::~shared_count((shared_count *)&inputs.val._M_string_length);
    }
LAB_00529a28:
    std::__cxx11::string::~string((string *)&strTest);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_valid)
{
    BOOST_CHECK_MESSAGE(CheckMapFlagNames(), "mapFlagNames is missing a script verification flag");
    // Read tests from test/data/tx_valid.json
    UniValue tests = read_json(json_tests::tx_valid);

    for (unsigned int idx = 0; idx < tests.size(); idx++) {
        const UniValue& test = tests[idx];
        std::string strTest = test.write();
        if (test[0].isArray())
        {
            if (test.size() != 3 || !test[1].isStr() || !test[2].isStr())
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::map<COutPoint, CScript> mapprevOutScriptPubKeys;
            std::map<COutPoint, int64_t> mapprevOutValues;
            UniValue inputs = test[0].get_array();
            bool fValid = true;
            for (unsigned int inpIdx = 0; inpIdx < inputs.size(); inpIdx++) {
                const UniValue& input = inputs[inpIdx];
                if (!input.isArray()) {
                    fValid = false;
                    break;
                }
                const UniValue& vinput = input.get_array();
                if (vinput.size() < 3 || vinput.size() > 4)
                {
                    fValid = false;
                    break;
                }
                COutPoint outpoint{Txid::FromHex(vinput[0].get_str()).value(), uint32_t(vinput[1].getInt<int>())};
                mapprevOutScriptPubKeys[outpoint] = ParseScript(vinput[2].get_str());
                if (vinput.size() >= 4)
                {
                    mapprevOutValues[outpoint] = vinput[3].getInt<int64_t>();
                }
            }
            if (!fValid)
            {
                BOOST_ERROR("Bad test: " << strTest);
                continue;
            }

            std::string transaction = test[1].get_str();
            DataStream stream(ParseHex(transaction));
            CTransaction tx(deserialize, TX_WITH_WITNESS, stream);

            TxValidationState state;
            BOOST_CHECK_MESSAGE(CheckTransaction(tx, state), strTest);
            BOOST_CHECK(state.IsValid());

            PrecomputedTransactionData txdata(tx);
            unsigned int verify_flags = ParseScriptFlags(test[2].get_str());

            // Check that the test gives a valid combination of flags (otherwise VerifyScript will throw). Don't edit the flags.
            if (~verify_flags != FillFlags(~verify_flags)) {
                BOOST_ERROR("Bad test flags: " << strTest);
            }

            BOOST_CHECK_MESSAGE(CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, ~verify_flags, txdata, strTest, /*expect_valid=*/true),
                                "Tx unexpectedly failed: " << strTest);

            // Backwards compatibility of script verification flags: Removing any flag(s) should not invalidate a valid transaction
            for (const auto& [name, flag] : mapFlagNames) {
                // Removing individual flags
                unsigned int flags = TrimFlags(~(verify_flags | flag));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Tx unexpectedly failed with flag " << name << " unset: " << strTest);
                }
                // Removing random combinations of flags
                flags = TrimFlags(~(verify_flags | (unsigned int)m_rng.randbits(mapFlagNames.size())));
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, flags, txdata, strTest, /*expect_valid=*/true)) {
                    BOOST_ERROR("Tx unexpectedly failed with random flags " << ToString(flags) << ": " << strTest);
                }
            }

            // Check that flags are maximal: transaction should fail if any unset flags are set.
            for (auto flags_excluding_one : ExcludeIndividualFlags(verify_flags)) {
                if (!CheckTxScripts(tx, mapprevOutScriptPubKeys, mapprevOutValues, ~flags_excluding_one, txdata, strTest, /*expect_valid=*/false)) {
                    BOOST_ERROR("Too many flags unset: " << strTest);
                }
            }
        }
    }
}